

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlayout.cpp
# Opt level: O1

int __thiscall QLayout::totalMinimumHeightForWidth(QLayout *this,int w)

{
  long lVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  QWidget *this_00;
  int iVar5;
  
  lVar1 = *(long *)&this->field_0x8;
  iVar5 = 0;
  iVar3 = 0;
  if ((*(byte *)(lVar1 + 0x8c) & 1) != 0) {
    this_00 = parentWidget(this);
    QWidget::ensurePolished(this_00);
    lVar2 = *(long *)&this_00->field_0x8;
    iVar3 = (int)*(short *)(lVar2 + 0x19c) + (int)*(short *)(lVar2 + 0x198);
    iVar5 = (int)*(short *)(lVar2 + 0x19e) + (int)*(short *)(lVar2 + 0x19a);
  }
  iVar3 = (*(this->super_QLayoutItem)._vptr_QLayoutItem[0xb])
                    (&this->super_QLayoutItem,(ulong)(uint)(w - iVar3));
  iVar4 = menuBarHeightForWidth(*(QWidget **)(lVar1 + 0xa8),w);
  return iVar4 + iVar3 + iVar5;
}

Assistant:

int QLayout::totalMinimumHeightForWidth(int w) const
{
    Q_D(const QLayout);
    int side=0, top=0;
    if (d->topLevel) {
        QWidget *parent = parentWidget();
        parent->ensurePolished();
        QWidgetPrivate *wd = parent->d_func();
        side += wd->leftmargin + wd->rightmargin;
        top += wd->topmargin + wd->bottommargin;
    }
    int h = minimumHeightForWidth(w - side) + top;
#if QT_CONFIG(menubar)
    h += menuBarHeightForWidth(d->menubar, w);
#endif
    return h;
}